

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt.cpp
# Opt level: O0

char * fmt::v6::internal::sprintf_format<double>(double value,buffer<char> *buf,sprintf_specs specs)

{
  int value_00;
  type tVar1;
  size_t sVar2;
  buffer<char> *pbVar3;
  type __n;
  char *pcVar4;
  ulong in_RSI;
  buffer<char> *in_RDI;
  bool bVar5;
  char *where;
  char *end;
  char *p;
  uint n;
  int result;
  size_t buffer_size;
  char *decimal_point_pos;
  char *start;
  char type;
  char *format_ptr;
  char format [10];
  buffer<char> *in_stack_ffffffffffffff68;
  buffer<char> *in_stack_ffffffffffffff70;
  buffer<char> *pbVar6;
  undefined8 in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  ulong in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  buffer<char> *local_60;
  buffer<char> *local_48;
  char local_31;
  char *local_30;
  char local_21 [9];
  buffer<char> *local_18;
  undefined8 local_8;
  
  local_30 = local_21;
  local_8._4_1_ = (char)(in_RSI >> 0x20);
  if (((in_RSI & 0x10000000000) != 0) || (local_8._4_1_ == '\0')) {
    local_30 = local_21 + 1;
    local_21[0] = '#';
  }
  local_8._0_4_ = (int)in_RSI;
  if (-1 < (int)local_8) {
    pcVar4 = local_30 + 1;
    *local_30 = '.';
    local_30 = local_30 + 2;
    *pcVar4 = '*';
  }
  local_31 = local_8._4_1_;
  if (local_8._4_1_ == '%') {
    local_31 = 'f';
  }
  else if ((local_8._4_1_ == '\0') || (local_8._4_1_ == 'n')) {
    local_31 = 'g';
  }
  *local_30 = local_31;
  local_30[1] = '\0';
  local_48 = (buffer<char> *)0x0;
  local_18 = in_RDI;
  local_8 = in_RSI;
  while( true ) {
    while( true ) {
      buffer<char>::capacity(local_18);
      buffer<char>::operator[](local_18,0);
      value_00 = format_float<double>
                           (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                            (char *)CONCAT17(in_stack_ffffffffffffff87,
                                             CONCAT16(in_stack_ffffffffffffff86,
                                                      CONCAT15(in_stack_ffffffffffffff85,
                                                               in_stack_ffffffffffffff80))),
                            (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                            (double)in_stack_ffffffffffffff70);
      if (-1 < value_00) break;
      in_stack_ffffffffffffff68 = local_18;
      buffer<char>::capacity(local_18);
      buffer<char>::reserve(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    }
    tVar1 = to_unsigned<int>(value_00);
    in_stack_ffffffffffffff88 = (ulong)tVar1;
    sVar2 = buffer<char>::capacity(local_18);
    if (in_stack_ffffffffffffff88 < sVar2) break;
    buffer<char>::reserve(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  }
  local_60 = (buffer<char> *)buffer<char>::data(local_18);
  pbVar3 = (buffer<char> *)((long)&local_60->_vptr_buffer + (ulong)tVar1);
  if ((*(char *)&local_60->_vptr_buffer == '+') || (*(char *)&local_60->_vptr_buffer == '-')) {
    local_60 = (buffer<char> *)((long)&local_60->_vptr_buffer + 1);
  }
  if ((local_8._4_1_ != 'a') && (local_8._4_1_ != 'A')) {
    while( true ) {
      bVar5 = false;
      if ((local_60 < pbVar3) && (bVar5 = false, '/' < *(char *)&local_60->_vptr_buffer)) {
        bVar5 = *(char *)&local_60->_vptr_buffer < ':';
      }
      if (!bVar5) break;
      local_60 = (buffer<char> *)((long)&local_60->_vptr_buffer + 1);
    }
    if ((((local_60 < pbVar3) && (*(char *)&local_60->_vptr_buffer != 'e')) &&
        (*(char *)&local_60->_vptr_buffer != 'E')) && (local_48 = local_60, local_8._4_1_ == '\0'))
    {
      pbVar6 = (buffer<char> *)((long)&local_60->_vptr_buffer + 1);
      if (*(char *)&pbVar6->_vptr_buffer == '0') {
        pbVar6 = (buffer<char> *)((long)&local_60->_vptr_buffer + 2);
      }
      while( true ) {
        local_60 = pbVar6;
        pbVar6 = local_60;
        bVar5 = false;
        if ((local_60 != pbVar3) && (bVar5 = false, '0' < *(char *)&local_60->_vptr_buffer)) {
          bVar5 = *(char *)&local_60->_vptr_buffer < ':';
        }
        if (!bVar5) break;
        pbVar6 = (buffer<char> *)((long)&local_60->_vptr_buffer + 1);
      }
      while( true ) {
        bVar5 = false;
        if (local_60 != pbVar3) {
          bVar5 = *(char *)&local_60->_vptr_buffer == '0';
        }
        if (!bVar5) break;
        local_60 = (buffer<char> *)((long)&local_60->_vptr_buffer + 1);
      }
      if ((((local_60 == pbVar3) || (*(char *)&local_60->_vptr_buffer < '0')) ||
          ('9' < *(char *)&local_60->_vptr_buffer)) && (local_60 != pbVar3)) {
        __n = to_unsigned<long>((long)pbVar3 - (long)local_60);
        memmove(pbVar6,local_60,__n);
        in_stack_ffffffffffffff70 = pbVar6;
      }
    }
  }
  buffer<char>::resize(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  return (char *)local_48;
}

Assistant:

char* sprintf_format(Double value, internal::buffer<char>& buf,
                                 sprintf_specs specs) {
                // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
                FMT_ASSERT(buf.capacity() != 0, "empty buffer");

                // Build format string.
                enum { max_format_size = 10 };  // longest format: %#-*.*Lg
                char format[max_format_size];
                char* format_ptr = format;
                *format_ptr++ = '%';
                if (specs.alt || !specs.type) *format_ptr++ = '#';
                if (specs.precision >= 0) {
                    *format_ptr++ = '.';
                    *format_ptr++ = '*';
                }
                if (std::is_same<Double, long double>::value) *format_ptr++ = 'L';

                char type = specs.type;

                if (type == '%')
                    type = 'f';
                else if (type == 0 || type == 'n')
                    type = 'g';
#if FMT_MSC_VER
                if (type == 'F') {
    // MSVC's printf doesn't support 'F'.
    type = 'f';
  }
#endif
                *format_ptr++ = type;
                *format_ptr = '\0';

                // Format using snprintf.
                char* start = nullptr;
                char* decimal_point_pos = nullptr;
                for (;;) {
                    std::size_t buffer_size = buf.capacity();
                    start = &buf[0];
                    int result =
                            format_float(start, buffer_size, format, specs.precision, value);
                    if (result >= 0) {
                        unsigned n = internal::to_unsigned(result);
                        if (n < buf.capacity()) {
                            // Find the decimal point.
                            auto p = buf.data(), end = p + n;
                            if (*p == '+' || *p == '-') ++p;
                            if (specs.type != 'a' && specs.type != 'A') {
                                while (p < end && *p >= '0' && *p <= '9') ++p;
                                if (p < end && *p != 'e' && *p != 'E') {
                                    decimal_point_pos = p;
                                    if (!specs.type) {
                                        // Keep only one trailing zero after the decimal point.
                                        ++p;
                                        if (*p == '0') ++p;
                                        while (p != end && *p >= '1' && *p <= '9') ++p;
                                        char* where = p;
                                        while (p != end && *p == '0') ++p;
                                        if (p == end || *p < '0' || *p > '9') {
                                            if (p != end) std::memmove(where, p, to_unsigned(end - p));
                                            n -= static_cast<unsigned>(p - where);
                                        }
                                    }
                                }
                            }
                            buf.resize(n);
                            break;  // The buffer is large enough - continue with formatting.
                        }
                        buf.reserve(n + 1);
                    } else {
                        // If result is negative we ask to increase the capacity by at least 1,
                        // but as std::vector, the buffer grows exponentially.
                        buf.reserve(buf.capacity() + 1);
                    }
                }
                return decimal_point_pos;
            }